

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

void __thiscall despot::Chain::ComputeOptimalValue(Chain *this,ChainState *state)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ACT_TYPE a;
  long lVar7;
  double v;
  double dVar8;
  undefined1 auVar9 [16];
  int iVar12;
  double dVar10;
  ulong uVar11;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  allocator_type local_71;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_70;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_58;
  undefined8 local_40;
  long local_38;
  
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&local_58,5,(allocator_type *)&local_70);
  auVar2 = _DAT_0010b070;
  lVar4 = 0x18;
  iVar3 = (int)DAT_0010b080;
  iVar12 = DAT_0010b080._4_4_;
  auVar9 = _DAT_0010b060;
  do {
    if (SUB164(auVar9 ^ auVar2,4) == iVar12 && SUB164(auVar9 ^ auVar2,0) < iVar3) {
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4 + -0x10) = 0;
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4) = 0;
    }
    lVar6 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar6 + 2;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x78);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&local_70,5,&local_71);
  local_40 = Globals::NEG_INFTY;
  lVar4 = 0;
  do {
    do {
      lVar6 = lVar4 * 0x10;
      *(undefined4 *)
       (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar6) = 0xffffffff;
      *(undefined8 *)
       (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar6 + 8) = local_40;
      lVar7 = 0;
      local_38 = lVar4;
      while( true ) {
        iVar3 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar3 <= lVar7) break;
        dVar8 = 0.0;
        lVar5 = 0;
        do {
          dVar10 = 2.0;
          if ((lVar5 != 0) && (dVar10 = 10.0, lVar5 != 0x20 || lVar4 != 4)) {
            dVar10 = 0.0;
          }
          dVar8 = dVar8 + (*(double *)
                            (local_58.
                             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2 + 8) *
                           ___cxa_finalize + dVar10) *
                          *(double *)
                           (*(long *)(*(long *)&(state->mdp_transitions_).
                                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data + lVar7 * 0x18) +
                           lVar5);
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0x28);
        if (*(double *)
             (local_70.
              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar6 + 8) <= dVar8 &&
            dVar8 != *(double *)
                      (local_70.
                       super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6 + 8)) {
          *(double *)
           (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar6 + 8) = dVar8;
          *(int *)(local_70.
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar6) = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
      }
      lVar4 = local_38 + 1;
    } while (lVar4 != 5);
    dVar8 = 0.0;
    lVar4 = 8;
    uVar11 = (ulong)DAT_0010b040;
    do {
      dVar8 = dVar8 + (double)((ulong)(*(double *)
                                        (local_70.
                                         super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar4) -
                                      *(double *)
                                       (local_58.
                                        super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4)) & uVar11
                              );
      uVar1 = *(undefined8 *)
               (local_70.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar4 + -8 + 8);
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4 + -8) =
           *(undefined8 *)
            (local_70.
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_start + lVar4 + -8);
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4 + -8 + 8) = uVar1;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x58);
    lVar4 = 0;
  } while (0.001 <= dVar8);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            (&state->policy,&local_58);
  if (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Chain::ComputeOptimalValue(ChainState& state) const {
	vector<ValuedAction> policy = vector<ValuedAction>(NUM_MDP_STATES);
	for (int s = 0; s < NUM_MDP_STATES; s++) {
		policy[s].value = 0;
	}

	vector<ValuedAction> next_policy = vector<ValuedAction>(NUM_MDP_STATES);
	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a < NumActions(); a++) {
				double v = 0;
				for (int nexts = 0; nexts < NUM_MDP_STATES; nexts++) {
					v += state.GetTransition(s, a, nexts)
						* (Reward(s, a, nexts)
							+ Globals::Discount() * policy[nexts].value);
				}

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			diff += fabs(next_policy[s].value - policy[s].value);
			policy[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}

	state.policy = policy;
}